

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

ostream * __thiscall cppcms::form_context::out(form_context *this)

{
  string *error;
  long in_RDI;
  allocator *this_00;
  allocator local_29;
  string local_28 [40];
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    error = (string *)__cxa_allocate_exception(0x30);
    this_00 = &local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Can\'t use form context without assigned output",this_00)
    ;
    cppcms_error::cppcms_error((cppcms_error *)this_00,error);
    __cxa_throw(error,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  return *(ostream **)(in_RDI + 0x10);
}

Assistant:

std::ostream &form_context::out() const
{
	if(!output_)
		throw cppcms_error("Can't use form context without assigned output");
	return *output_;
}